

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidgetPrivate::scrollChildren(QWidgetPrivate *this,int dx,int dy)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  QArrayData *pQVar5;
  QWidgetData *pQVar6;
  QPoint QVar7;
  QWidget *this_00;
  long lVar8;
  Representation RVar9;
  Representation RVar10;
  long in_FS_OFFSET;
  QPoint oldp;
  QPoint local_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QPoint local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = *(long *)(*(long *)&this->field_0x8 + 8);
  lVar4 = *(long *)(lVar3 + 0x28);
  if (lVar4 != 0) {
    pQVar5 = *(QArrayData **)(lVar3 + 0x18);
    lVar3 = *(long *)(lVar3 + 0x20);
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    lVar8 = 0;
    do {
      this_00 = *(QWidget **)(lVar3 + lVar8 * 8);
      if ((this_00 == (QWidget *)0x0) || ((*(byte *)(*(long *)&this_00->field_0x8 + 0x30) & 1) == 0)
         ) {
        this_00 = (QWidget *)0x0;
      }
      if ((this_00 != (QWidget *)0x0) &&
         (((this_00->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
           super_QFlagsStorage<Qt::WindowType>.i & 1) == 0)) {
        local_40 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        local_40 = QWidget::pos(this_00);
        QVar7 = QWidget::pos(this_00);
        RVar10.m_i = QVar7.xp.m_i.m_i + dx;
        RVar9.m_i = QVar7.yp.m_i.m_i + dy;
        pQVar6 = this_00->data;
        iVar1 = (pQVar6->crect).x1.m_i;
        iVar2 = (pQVar6->crect).y1.m_i;
        (pQVar6->crect).x1.m_i = RVar10.m_i;
        (pQVar6->crect).y1.m_i = RVar9.m_i;
        (pQVar6->crect).x2.m_i = ((pQVar6->crect).x2.m_i + RVar10.m_i) - iVar1;
        (pQVar6->crect).y2.m_i = ((pQVar6->crect).y2.m_i + RVar9.m_i) - iVar2;
        if (((*(QWidgetPrivate **)&this_00->field_0x8)->high_attributes[0] & 0x10000000) != 0) {
          setWSGeometry(*(QWidgetPrivate **)&this_00->field_0x8);
        }
        setDirtyOpaqueRegion(*(QWidgetPrivate **)&this_00->field_0x8);
        local_58 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
        local_68 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
        local_70.yp.m_i = RVar9.m_i;
        local_70.xp.m_i = RVar10.m_i;
        QMoveEvent::QMoveEvent((QMoveEvent *)&local_68,&local_70,&local_40);
        QCoreApplication::sendEvent(&this_00->super_QObject,(QEvent *)&local_68);
        QMoveEvent::~QMoveEvent((QMoveEvent *)&local_68);
      }
      lVar8 = lVar8 + 1;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar8);
    if (pQVar5 != (QArrayData *)0x0) {
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar5,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::scrollChildren(int dx, int dy)
{
    Q_Q(QWidget);
    if (q->children().size() > 0) {        // scroll children
        QPoint pd(dx, dy);
        QObjectList childObjects = q->children();
        for (int i = 0; i < childObjects.size(); ++i) { // move all children
            QWidget *w = qobject_cast<QWidget*>(childObjects.at(i));
            if (w && !w->isWindow()) {
                QPoint oldp = w->pos();
                QRect  r(w->pos() + pd, w->size());
                w->data->crect = r;
                if (w->testAttribute(Qt::WA_WState_Created))
                    w->d_func()->setWSGeometry();
                w->d_func()->setDirtyOpaqueRegion();
                QMoveEvent e(r.topLeft(), oldp);
                QCoreApplication::sendEvent(w, &e);
            }
        }
    }
}